

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkFaninFanoutCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  
  lVar6 = (long)pNtk->vObjs->nSize;
  if (lVar6 < 1) {
    iVar12 = 0;
    iVar11 = 0;
  }
  else {
    lVar9 = 0;
    iVar11 = 0;
    iVar12 = 0;
    do {
      pvVar3 = pNtk->vObjs->pArray[lVar9];
      if (pvVar3 != (void *)0x0) {
        if (iVar12 <= *(int *)((long)pvVar3 + 0x1c)) {
          iVar12 = *(int *)((long)pvVar3 + 0x1c);
        }
        if (iVar11 <= *(int *)((long)pvVar3 + 0x2c)) {
          iVar11 = *(int *)((long)pvVar3 + 0x2c);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  uVar2 = iVar12 + 1;
  uVar8 = (ulong)uVar2;
  if (vFan->nCap <= iVar12) {
    if (vFan->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(uVar8 * 4);
    }
    else {
      piVar7 = (int *)realloc(vFan->pArray,uVar8 * 4);
    }
    vFan->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_002ee3c4;
    vFan->nCap = uVar2;
  }
  memset(vFan->pArray,0,uVar8 * 4);
  vFan->nSize = uVar2;
  uVar1 = iVar11 + 1;
  uVar10 = (ulong)uVar1;
  if (vFon->nCap <= iVar11) {
    if (vFon->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(uVar10 * 4);
    }
    else {
      piVar7 = (int *)realloc(vFon->pArray,uVar10 * 4);
    }
    vFon->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_002ee3c4;
    vFon->nCap = uVar1;
  }
  memset(vFon->pArray,0,uVar10 * 4);
  vFon->nSize = uVar1;
  if (vFanR->nCap <= iVar12) {
    if (vFanR->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(uVar8 * 4);
    }
    else {
      piVar7 = (int *)realloc(vFanR->pArray,uVar8 * 4);
    }
    vFanR->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_002ee3c4;
    vFanR->nCap = uVar2;
  }
  memset(vFanR->pArray,0,uVar8 << 2);
  vFanR->nSize = uVar2;
  if (vFonR->nCap <= iVar11) {
    if (vFonR->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(uVar10 * 4);
    }
    else {
      piVar7 = (int *)realloc(vFonR->pArray,uVar10 * 4);
    }
    vFonR->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_002ee3c4:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFonR->nCap = uVar1;
  }
  memset(vFonR->pArray,0,uVar10 << 2);
  vFonR->nSize = uVar1;
  pVVar4 = pNtk->vObjs;
  uVar8 = (long)pVVar4->nSize;
  if (0 < (long)pVVar4->nSize) {
    do {
      if ((long)pVVar4->nSize < (long)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar4->pArray[uVar8 - 1];
      if (pvVar3 != (void *)0x0) {
        iVar12 = *(int *)((long)pvVar3 + 0x1c);
        lVar6 = (long)iVar12;
        if ((lVar6 < 0) || (vFan->nSize <= iVar12)) {
LAB_002ee367:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        uVar2 = *(uint *)((long)pvVar3 + 0x2c);
        vFan->pArray[lVar6] = vFan->pArray[lVar6] + 1;
        if (((int)uVar2 < 0) || (vFon->nSize <= (int)uVar2)) goto LAB_002ee367;
        vFon->pArray[uVar2] = vFon->pArray[uVar2] + 1;
        if (vFanR->nSize <= iVar12) {
LAB_002ee386:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar12 = (int)uVar8 + -1;
        vFanR->pArray[lVar6] = iVar12;
        if (vFonR->nSize <= (int)uVar2) goto LAB_002ee386;
        vFonR->pArray[uVar2] = iVar12;
      }
      bVar5 = 1 < uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar5);
  }
  return;
}

Assistant:

void Abc_NtkFaninFanoutCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(pNode) );
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    }
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachObjReverse( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( pNode );
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, i );
        Vec_IntWriteEntry( vFonR, nFanouts, i );
    }
}